

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpGCTest_Collect_TableCycle_Test::TestBody(InterpGCTest_Collect_TableCycle_Test *this)

{
  Store *this_00;
  char *pcVar1;
  AssertionResult gtest_ar;
  Index after_new;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  internal local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  RefPtr<wabt::interp::Table> local_128;
  RefPtr<wabt::interp::Table> local_108;
  AssertHelper local_e8;
  unsigned_long local_e0;
  RefPtr<wabt::interp::Table> local_d8;
  TableType local_c0;
  TableType local_90;
  TableType local_60;
  
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_;
  local_60.super_ExternType.kind = Table;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00246170;
  local_60.super_ExternType._12_4_ = 0xffffffef;
  local_60._16_4_ = 0;
  local_60.limits.initial = 2;
  local_60.limits.max = 0xffffffff;
  local_60.limits.has_max = false;
  local_60.limits.is_shared = false;
  local_60.limits.is_64 = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_128,this_00,this_00,&local_60);
  local_90.super_ExternType.kind = Table;
  local_90.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00246170;
  local_90.super_ExternType._12_4_ = 0xffffffef;
  local_90._16_4_ = 0;
  local_90.limits.initial = 2;
  local_90.limits.max = 0xffffffff;
  local_90.limits.has_max = false;
  local_90.limits.is_shared = false;
  local_90.limits.is_64 = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_108,this_00,this_00,&local_90);
  local_c0.super_ExternType.kind = Table;
  local_c0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00246170;
  local_c0.super_ExternType._12_4_ = 0xffffffef;
  local_c0._16_4_ = 0;
  local_c0.limits.initial = 2;
  local_c0.limits.max = 0xffffffff;
  local_c0.limits.has_max = false;
  local_c0.limits.is_shared = false;
  local_c0.limits.is_64 = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_d8,this_00,this_00,&local_c0);
  wabt::interp::Table::Set
            (local_128.obj_,this_00,0,(Ref)((local_128.obj_)->super_Extern).super_Object.self_.index
            );
  wabt::interp::Table::Set
            (local_108.obj_,this_00,0,(Ref)((local_d8.obj_)->super_Extern).super_Object.self_.index)
  ;
  wabt::interp::Table::Set
            (local_d8.obj_,this_00,0,(Ref)((local_108.obj_)->super_Extern).super_Object.self_.index)
  ;
  wabt::interp::Table::Set
            (local_d8.obj_,this_00,1,(Ref)((local_128.obj_)->super_Extern).super_Object.self_.index)
  ;
  local_e0 = ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                             ._M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                    super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) -
             (this->super_InterpGCTest).super_InterpTest.store_.objects_.free_items_;
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_138,"before_new + 3","after_new",(unsigned_long *)&local_140,&local_e0);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x26d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  if (local_128.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_128.store_,local_128.root_index_);
    local_128.obj_ = (Table *)0x0;
    local_128.store_ = (Store *)0x0;
    local_128.root_index_ = 0;
  }
  if (local_108.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_108.store_,local_108.root_index_);
    local_108.obj_ = (Table *)0x0;
    local_108.store_ = (Store *)0x0;
    local_108.root_index_ = 0;
  }
  wabt::interp::Store::Collect(this_00);
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                        ._M_impl + 8) -
         (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) -
       (this->super_InterpGCTest).super_InterpTest.store_.objects_.free_items_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_138,"after_new","store_.object_count()",&local_e0,(unsigned_long *)&local_140);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x273,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_140._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  if (local_d8.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_d8.store_,local_d8.root_index_);
  }
  if (local_108.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_108.store_,local_108.root_index_);
  }
  if (local_128.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_128.store_,local_128.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::ExternRef, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}